

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandleDelphiCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  size_t sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  char *local_258 [4];
  string coverageFile;
  string BinDir;
  cmParseDelphiCoverage cov;
  Glob g;
  ostringstream cmCTestLog_msg;
  
  cmParseDelphiCoverage::cmParseDelphiCoverage(&cov,cont,(this->super_cmCTestGenericHandler).CTest);
  cmsys::Glob::Glob(&g);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  g.Recurse = true;
  cmCTest::GetBinaryDir_abi_cxx11_(&BinDir,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&coverageFile,&BinDir,"/*(*.pas).html");
  cmsys::Glob::FindFiles(&g,&coverageFile,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&g);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&files,__x);
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Cannot find Delphi coverage files: ");
    poVar3 = std::operator<<(poVar3,(string *)&coverageFile);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x31c,local_258[0],(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Found Delphi HTML Files, Performing Coverage");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x316,local_258[0],(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmParseDelphiCoverage::LoadCoverageData(&cov,&files);
  }
  sVar2 = (cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::~string((string *)&coverageFile);
  std::__cxx11::string::~string((string *)&BinDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmsys::Glob::~Glob(&g);
  return (int)sVar2;
}

Assistant:

int cmCTestCoverageHandler::HandleDelphiCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParseDelphiCoverage cov = cmParseDelphiCoverage(*cont, this->CTest);
  cmsys::Glob g;
  std::vector<std::string> files;
  g.SetRecurse(true);

  std::string BinDir = this->CTest->GetBinaryDir();
  std::string coverageFile = BinDir + "/*(*.pas).html";

  g.FindFiles(coverageFile);
  files = g.GetFiles();
  if (!files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found Delphi HTML Files, Performing Coverage"
                         << std::endl,
                       this->Quiet);
    cov.LoadCoverageData(files);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find Delphi coverage files: " << coverageFile
                                                              << std::endl,
                       this->Quiet);
  }
  return static_cast<int>(cont->TotalCoverage.size());
}